

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O3

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_nullmutex>::set_pattern
          (ansicolor_sink<spdlog::details::console_nullmutex> *this,string *pattern)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  formatter *pfVar3;
  pattern_formatter *this_00;
  pointer local_a8;
  size_type local_a0;
  char local_98;
  undefined7 uStack_97;
  undefined8 uStack_90;
  pointer local_88;
  size_type local_80;
  char local_78;
  undefined7 uStack_77;
  undefined8 uStack_70;
  _Hashtable<char,_std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  this_00 = (pattern_formatter *)operator_new(0xe0);
  pcVar2 = (pattern->_M_dataplus)._M_p;
  local_88 = &local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,pcVar2 + pattern->_M_string_length);
  local_a8 = &local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"\n","");
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._4_4_ = 0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  (this_00->super_formatter)._vptr_formatter = (_func_int **)&PTR__pattern_formatter_001b1068;
  paVar1 = &(this_00->pattern_).field_2;
  (this_00->pattern_)._M_dataplus._M_p = (pointer)paVar1;
  if (local_88 == &local_78) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_77,local_78);
    *(undefined8 *)((long)(this_00->pattern_).field_2._M_local_buf + 8) = uStack_70;
  }
  else {
    (this_00->pattern_)._M_dataplus._M_p = local_88;
    paVar1->_M_allocated_capacity = CONCAT71(uStack_77,local_78);
  }
  (this_00->pattern_)._M_string_length = local_80;
  local_80 = 0;
  local_78 = '\0';
  paVar1 = &(this_00->eol_).field_2;
  (this_00->eol_)._M_dataplus._M_p = (pointer)paVar1;
  if (local_a8 == &local_98) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_97,local_98);
    *(undefined8 *)((long)(this_00->eol_).field_2._M_local_buf + 8) = uStack_90;
  }
  else {
    (this_00->eol_)._M_dataplus._M_p = local_a8;
    (this_00->eol_).field_2._M_allocated_capacity = CONCAT71(uStack_97,local_98);
  }
  (this_00->eol_)._M_string_length = local_a0;
  local_a0 = 0;
  local_98 = '\0';
  this_00->pattern_time_type_ = local;
  this_00->need_localtime_ = false;
  (this_00->last_log_secs_).__r = 0;
  (this_00->formatters_).
  super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->formatters_).
  super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->formatters_).
  super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8 = &local_98;
  local_88 = &local_78;
  std::
  _Hashtable<char,_std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&(this_00->custom_handlers_)._M_h,&local_68);
  (this_00->cached_tm_).tm_zone = (char *)0x0;
  *(undefined8 *)&(this_00->cached_tm_).tm_isdst = 0;
  (this_00->cached_tm_).tm_gmtoff = 0;
  (this_00->cached_tm_).tm_mon = 0;
  (this_00->cached_tm_).tm_year = 0;
  (this_00->cached_tm_).tm_wday = 0;
  (this_00->cached_tm_).tm_yday = 0;
  (this_00->cached_tm_).tm_sec = 0;
  (this_00->cached_tm_).tm_min = 0;
  (this_00->cached_tm_).tm_hour = 0;
  (this_00->cached_tm_).tm_mday = 0;
  pattern_formatter::compile_pattern_(this_00,&this_00->pattern_);
  pfVar3 = (this->formatter_)._M_t.
           super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
           super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
           super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
  (this->formatter_)._M_t.
  super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
  super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
  super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl = (formatter *)this_00;
  if (pfVar3 != (formatter *)0x0) {
    (*pfVar3->_vptr_formatter[1])();
  }
  std::
  _Hashtable<char,_std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  if (local_a8 != &local_98) {
    operator_delete(local_a8);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  return;
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::set_pattern(const std::string &pattern) {
    std::lock_guard<mutex_t> lock(mutex_);
    formatter_ = std::unique_ptr<spdlog::formatter>(new pattern_formatter(pattern));
}